

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall
google::protobuf::UnknownFieldSet::DeleteSubrange(UnknownFieldSet *this,int start,int num)

{
  LogMessage *other;
  reference pvVar1;
  size_type sVar2;
  reference pvVar3;
  int local_74;
  int local_70;
  int i_2;
  int i_1;
  int i;
  byte local_51;
  LogMessage local_50;
  int local_18;
  int local_14;
  int num_local;
  int start_local;
  UnknownFieldSet *this_local;
  
  local_51 = 0;
  local_18 = num;
  local_14 = start;
  _num_local = this;
  if (this->fields_ ==
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x9e);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: fields_ != NULL: ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&i_1 + 3),other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  for (i_2 = 0; i_2 < local_18; i_2 = i_2 + 1) {
    pvVar1 = std::
             vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ::operator[](this->fields_,(long)(i_2 + local_14));
    UnknownField::Delete(pvVar1);
  }
  for (local_70 = local_14 + local_18;
      sVar2 = std::
              vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              ::size(this->fields_), (ulong)(long)local_70 < sVar2; local_70 = local_70 + 1) {
    pvVar1 = std::
             vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ::operator[](this->fields_,(long)local_70);
    pvVar3 = std::
             vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             ::operator[](this->fields_,(long)(local_70 - local_18));
    *(undefined8 *)pvVar3 = *(undefined8 *)pvVar1;
    pvVar3->field_2 = pvVar1->field_2;
  }
  for (local_74 = 0; local_74 < local_18; local_74 = local_74 + 1) {
    std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
    pop_back(this->fields_);
  }
  return;
}

Assistant:

void UnknownFieldSet::DeleteSubrange(int start, int num) {
  GOOGLE_DCHECK(fields_ != NULL);
  // Delete the specified fields.
  for (int i = 0; i < num; ++i) {
    (*fields_)[i + start].Delete();
  }
  // Slide down the remaining fields.
  for (int i = start + num; i < fields_->size(); ++i) {
    (*fields_)[i - num] = (*fields_)[i];
  }
  // Pop off the # of deleted fields.
  for (int i = 0; i < num; ++i) {
    fields_->pop_back();
  }
}